

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_hkdf_expand_label
              (ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
              char *label,ptls_iovec_t hash_value,char *label_prefix)

{
  ptls_iovec_t info;
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  uint8_t *puVar6;
  char *__s;
  ptls_iovec_t prk;
  uint8_t hkdf_label_buf [80];
  ptls_buffer_t local_d8;
  uint8_t *local_b8;
  size_t local_b0;
  ptls_hash_algorithm_t *local_a8;
  void *local_a0;
  uint8_t *local_98;
  size_t sStack_90;
  uint8_t local_88 [88];
  
  prk.len = secret.len;
  local_d8.base = local_88;
  local_d8.off = 0;
  local_d8.capacity = 0x50;
  local_d8._24_8_ = local_d8._24_8_ & 0xffffffffffff0000;
  local_a8 = algo;
  local_a0 = output;
  iVar2 = ptls_buffer_reserve_aligned(&local_d8,2,'\0');
  if (iVar2 == 0) {
    *(ushort *)(local_d8.base + local_d8.off) = (ushort)outlen << 8 | (ushort)outlen >> 8;
    local_d8.off = local_d8.off + 2;
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    iVar2 = ptls_buffer_reserve_aligned(&local_d8,1,'\0');
    if (iVar2 == 0) {
      local_d8.base[local_d8.off] = '\0';
      local_d8.off = local_d8.off + 1;
      iVar2 = 0;
    }
    iVar5 = 6;
    puVar6 = secret.base;
    if (iVar2 == 0) {
      local_b0 = local_d8.off;
      __s = "tls13 ";
      if (label_prefix != (char *)0x0) {
        __s = label_prefix;
      }
      local_b8 = secret.base;
      sVar3 = strlen(__s);
      iVar2 = ptls_buffer__do_pushv(&local_d8,__s,sVar3);
      puVar6 = local_b8;
      if (iVar2 == 0) {
        sVar3 = strlen(label);
        iVar2 = ptls_buffer__do_pushv(&local_d8,label,sVar3);
        puVar6 = local_b8;
        if (iVar2 == 0) {
          iVar2 = 0x20c;
          if (local_d8.off - local_b0 < 0x100) {
            local_d8.base[local_b0 - 1] = (uint8_t)(local_d8.off - local_b0);
            iVar5 = 0;
            iVar2 = 0;
          }
        }
      }
    }
    if (iVar5 != 6) {
      if (iVar5 != 0) {
        return iVar2;
      }
      iVar2 = ptls_buffer_reserve_aligned(&local_d8,1,'\0');
      if (iVar2 == 0) {
        local_d8.base[local_d8.off] = '\0';
        local_d8.off = local_d8.off + 1;
        iVar2 = 0;
      }
      sVar1 = local_d8.off;
      iVar5 = 6;
      if ((iVar2 == 0) &&
         (iVar2 = ptls_buffer__do_pushv(&local_d8,hash_value.base,hash_value.len), iVar2 == 0)) {
        uVar4 = local_d8.off - sVar1;
        iVar2 = 0x20c;
        if (uVar4 < 0x100) {
          local_d8.base[sVar1 - 1] = (uint8_t)uVar4;
          iVar5 = 0;
          iVar2 = 0;
        }
      }
      if (iVar5 != 6) {
        if (iVar5 != 0) {
          return iVar2;
        }
        local_98 = local_d8.base;
        sStack_90 = local_d8.off;
        info.len = local_d8.off;
        info.base = local_d8.base;
        prk.base = puVar6;
        iVar2 = ptls_hkdf_expand(local_a8,local_a0,outlen,prk,info);
      }
    }
  }
  puVar6 = local_d8.base;
  (*ptls_clear_memory)(local_d8.base,local_d8.off);
  if (local_d8.is_allocated != '\0') {
    free(puVar6);
  }
  return iVar2;
}

Assistant:

int ptls_hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                           ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[80];
    int ret;

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        if (label_prefix == NULL)
            label_prefix = PTLS_HKDF_EXPAND_LABEL_PREFIX;
        ptls_buffer_pushv(&hkdf_label, label_prefix, strlen(label_prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}